

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mt.cpp
# Opt level: O1

void __thiscall testMt::test_method(testMt *this)

{
  int iVar1;
  text_oarchive oa;
  System aSystem;
  ofstream ofs;
  undefined1 local_390 [136];
  System local_308 [8];
  void *local_300;
  long local_2f0;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  dynamicgraph::CPU::System::System(local_308);
  std::ofstream::ofstream(&local_210,"cpu_state.dat",_S_out);
  boost::archive::text_oarchive::text_oarchive((text_oarchive *)local_390,(ostream *)&local_210,0);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_dynamicgraph::CPU::System>_>
  ::get_instance();
  boost::archive::detail::basic_oarchive::save_object(local_390,(basic_oserializer *)local_308);
  iVar1 = 10;
  do {
    usleep(100000);
    dynamicgraph::CPU::System::readProcStat();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)local_390);
  boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive
            ((basic_text_oprimitive<std::ostream> *)(local_390 + 0x30));
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _basic_oserializer;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  if (local_300 != (void *)0x0) {
    operator_delete(local_300,local_2f0 - (long)local_300);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testMt) {
  dynamicgraph::CPU::System aSystem;

  // create and open a character archive for output
  std::ofstream ofs("cpu_state.dat");
  boost::archive::text_oarchive oa(ofs);
  oa << aSystem;

  for (unsigned int i = 0; i < 10; i++) {
    usleep(100000);
    aSystem.readProcStat();
  }
}